

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_visibility.hpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> *
eos::render::compute_per_vertex_self_occlusion
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
          vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          *viewspace_vertices,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
          *triangle_vertex_indices,RayDirection ray_direction_type)

{
  bool bVar1;
  reference probe_vertex;
  bool visible;
  Matrix<float,_3,_1,_0,_3,_1> *vertex;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  *__range2;
  RayDirection ray_direction_type_local;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
  *triangle_vertex_indices_local;
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  *viewspace_vertices_local;
  vector<bool,_std::allocator<bool>_> *per_vertex_visibility;
  
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__);
  __end2 = std::
           vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ::begin(viewspace_vertices);
  vertex = (Matrix<float,_3,_1,_0,_3,_1> *)
           std::
           vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ::end(viewspace_vertices);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                                     *)&vertex), bVar1) {
    probe_vertex = __gnu_cxx::
                   __normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                   ::operator*(&__end2);
    bVar1 = is_vertex_visible(probe_vertex,viewspace_vertices,triangle_vertex_indices,
                              ray_direction_type);
    std::vector<bool,_std::allocator<bool>_>::push_back(__return_storage_ptr__,bVar1);
    __gnu_cxx::
    __normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<bool>
compute_per_vertex_self_occlusion(const std::vector<Eigen::Vector3f>& viewspace_vertices,
                                  const std::vector<std::array<int, 3>>& triangle_vertex_indices,
                                  detail::RayDirection ray_direction_type)
{
    // We are already given vertices in view space (or we should not transform them).
    std::vector<bool> per_vertex_visibility;
    for (const auto& vertex : viewspace_vertices)
    {
        const bool visible =
            is_vertex_visible(vertex, viewspace_vertices, triangle_vertex_indices, ray_direction_type);
        per_vertex_visibility.push_back(visible);
    }
    return per_vertex_visibility;
}